

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O2

void PutBits(INT32 Number,UINT32 Value)

{
  UINT8 *pUVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pUVar1 = mDstUpperLimit;
  pbVar3 = mDst;
  while( true ) {
    iVar2 = Number - mBitCount;
    if (Number < mBitCount) break;
    pbVar4 = pbVar3;
    if (pbVar3 < pUVar1) {
      pbVar4 = pbVar3 + 1;
      mDst = pbVar4;
      *pbVar3 = (byte)mSubBitBuf | (byte)(Value >> ((byte)iVar2 & 0x1f));
    }
    mSubBitBuf = 0;
    mBitCount = 8;
    pbVar3 = pbVar4;
    Number = iVar2;
    mCompSize = mCompSize + 1;
  }
  mBitCount = mBitCount - Number;
  mSubBitBuf = mSubBitBuf | Value << ((byte)mBitCount & 0x1f);
  return;
}

Assistant:

STATIC 
VOID 
PutBits (
  IN INT32 n, 
  IN UINT32 x
  )
/*++

Routine Description:

  Outputs rightmost n bits of x

Argments:

  n   - the rightmost n bits of the data is used
  x   - the data 

Returns: (VOID)

--*/
{
  UINT8 Temp;  
  
  if (n < mBitCount) {
    mSubBitBuf |= x << (mBitCount -= n);
  } else {
      
    Temp = (UINT8)(mSubBitBuf | (x >> (n -= mBitCount)));
    if (mDst < mDstUpperLimit) {
      *mDst++ = Temp;
    }
    mCompSize++;

    if (n < UINT8_BIT) {
      mSubBitBuf = x << (mBitCount = UINT8_BIT - n);
    } else {
        
      Temp = (UINT8)(x >> (n - UINT8_BIT));
      if (mDst < mDstUpperLimit) {
        *mDst++ = Temp;
      }
      mCompSize++;
      
      mSubBitBuf = x << (mBitCount = 2 * UINT8_BIT - n);
    }
  }
}